

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  double *pdVar11;
  char *pcVar12;
  int iVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  undefined4 uVar17;
  undefined4 uVar19;
  double dVar18;
  double dVar20;
  double dVar21;
  SUNContext sunctx;
  sunrealtype tret;
  longdouble lVar22;
  double local_f0;
  int local_e8;
  double local_d8;
  undefined8 local_c0;
  double local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double *local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  longdouble local_3c;
  
  local_c0 = 0;
  if (argc < 2) {
    local_e8 = 4;
    iVar13 = 8;
    bVar2 = false;
    local_d8 = 6.283185307179586;
    local_f0 = 0.001;
    uVar17 = 0;
  }
  else {
    local_e8 = 4;
    iVar13 = 8;
    local_b8 = 0.0;
    bVar2 = true;
    local_d8 = 6.283185307179586;
    uVar17 = 0xd2f1a9fc;
    uVar19 = 0x3f50624d;
    iVar6 = 1;
    do {
      pcVar12 = argv[iVar6];
      iVar4 = strcmp(pcVar12,"--order");
      if (iVar4 == 0) {
        iVar4 = iVar6 + 1;
        local_e8 = atoi(argv[(long)iVar6 + 1]);
      }
      else {
        iVar4 = strcmp(pcVar12,"--tf");
        if (iVar4 == 0) {
          iVar4 = iVar6 + 1;
          local_d8 = strtod(argv[(long)iVar6 + 1],(char **)0x0);
        }
        else {
          iVar4 = strcmp(pcVar12,"--dt");
          if (iVar4 == 0) {
            dVar20 = strtod(argv[(long)iVar6 + 1],(char **)0x0);
            uVar17 = SUB84(dVar20,0);
            uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
            iVar4 = iVar6 + 1;
          }
          else {
            iVar4 = strcmp(pcVar12,"--nout");
            if (iVar4 == 0) {
              iVar4 = iVar6 + 1;
              iVar13 = atoi(argv[(long)iVar6 + 1]);
            }
            else {
              iVar5 = strcmp(pcVar12,"--use-compensated-sums");
              iVar4 = iVar6;
              if (iVar5 == 0) {
                local_b8 = 4.94065645841247e-324;
              }
              else {
                iVar6 = strcmp(pcVar12,"--disable-tstop");
                bVar2 = false;
                if (iVar6 != 0) {
                  main_cold_1();
                  return 1;
                }
              }
            }
          }
        }
      }
      iVar6 = iVar4 + 1;
    } while (iVar6 < argc);
    local_f0 = (double)CONCAT44(uVar19,uVar17);
    bVar2 = !bVar2;
    uVar17 = SUB84(local_b8,0);
  }
  uVar7 = SUNContext_Create(0,&local_c0);
  if ((int)uVar7 < 0) {
    pcVar12 = "SUNContext_Create";
  }
  else {
    puts("\n   Begin simple harmonic oscillator problem\n");
    local_98 = 10.0;
    dStack_90 = 0.0;
    local_88 = 1.0;
    uVar8 = N_VNew_Serial(2,local_c0);
    uVar9 = N_VClone(uVar8);
    local_78 = (double *)N_VGetArrayPointer(uVar8);
    *local_78 = 10.0;
    local_78[1] = -0.0;
    uVar10 = SPRKStepCreate(0,xdot,vdot,uVar8,local_c0);
    local_48 = uVar10;
    uVar7 = ARKodeSetOrder(uVar10,local_e8);
    if ((int)uVar7 < 0) {
      pcVar12 = "ARKodeSetOrder";
    }
    else {
      uVar7 = ARKodeSetUserData(uVar10,&local_98);
      if ((int)uVar7 < 0) {
        pcVar12 = "ARKodeSetUserData";
      }
      else {
        uVar7 = SPRKStepSetUseCompensatedSums(uVar10,uVar17);
        if ((int)uVar7 < 0) {
          pcVar12 = "SPRKStepSetUseCompensatedSums";
        }
        else {
          uVar7 = ARKodeSetFixedStep(SUB84(local_f0,0),uVar10);
          if ((int)uVar7 < 0) {
            pcVar12 = "ARKodeSetFixedStep";
          }
          else {
            dVar20 = ceil(local_d8 / local_f0);
            uVar7 = ARKodeSetMaxNumSteps(uVar10,(long)dVar20 + 2);
            pFVar3 = _stdout;
            if (-1 < (int)uVar7) {
              local_a0 = 0.0;
              lVar14 = (longdouble)*local_78;
              pdVar11 = (double *)N_VGetArrayPointer(uVar8);
              local_50 = (pdVar11[1] * pdVar11[1] + local_88 * local_88 * *pdVar11 * *pdVar11) * 0.5
              ;
              lVar15 = (longdouble)local_50;
              lVar22 = (longdouble)0;
              lVar16 = lVar22;
              fprintf(pFVar3,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n");
              if (0 < iVar13) {
                local_68 = local_d8 / (double)iVar13;
                dVar20 = local_68 + 0.0;
                local_70 = (double)(local_e8 + -2);
                do {
                  if (!bVar2) {
                    ARKodeSetStopTime(SUB84(dVar20,0),uVar10);
                  }
                  iVar6 = ARKodeEvolve(SUB84(dVar20,0),uVar10,uVar8,&local_a0,1,in_R8,in_R9,lVar22,
                                       lVar14,lVar15,lVar16);
                  dVar21 = local_a0;
                  pdVar11 = (double *)N_VGetArrayPointer(uVar9);
                  local_b8 = local_98;
                  dVar18 = cos(local_88 * dVar21 + dStack_90);
                  *pdVar11 = dVar18 * local_b8;
                  local_b8 = -local_98 * local_88;
                  uStack_b0 = 0;
                  uStack_ae = 0x800000000000;
                  dVar18 = sin(local_88 * dVar21 + dStack_90);
                  pdVar11[1] = dVar18 * local_b8;
                  N_VLinearSum(0,0xbff0000000000000,uVar8,uVar9,uVar9);
                  dVar18 = (double)N_VDotProd(uVar9,uVar9);
                  if (dVar18 < 0.0) {
                    dVar18 = sqrt(dVar18);
                  }
                  else {
                    dVar18 = SQRT(dVar18);
                  }
                  pFVar3 = _stdout;
                  local_b8 = SUB108((longdouble)local_a0,0);
                  uStack_b0 = (undefined2)((unkuint10)(longdouble)local_a0 >> 0x40);
                  local_3c = (longdouble)*local_78;
                  pdVar11 = (double *)N_VGetArrayPointer(uVar8);
                  local_60 = (pdVar11[1] * pdVar11[1] + local_88 * local_88 * *pdVar11 * *pdVar11) *
                             0.5;
                  lVar15 = (longdouble)local_60;
                  lVar16 = (longdouble)dVar18;
                  lVar22 = (longdouble)CONCAT28(uStack_b0,local_b8);
                  lVar14 = local_3c;
                  local_58 = dVar18;
                  fprintf(pFVar3,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n");
                  dVar1 = pow(10.0,local_70);
                  dVar21 = 2.220446049250313e-13;
                  if (2.220446049250313e-13 < local_f0 / dVar1) {
                    dVar21 = pow(10.0,local_70);
                    dVar21 = local_f0 / dVar21;
                  }
                  if (dVar21 < dVar18) {
                    main_cold_3();
                    return 1;
                  }
                  if (iVar6 < 0) {
                    main_cold_2();
                    break;
                  }
                  dVar18 = dVar20 + local_68;
                  dVar20 = local_d8;
                  if (dVar18 <= local_d8) {
                    dVar20 = dVar18;
                  }
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
              fputc(10,_stdout);
              N_VDestroy(uVar8);
              N_VDestroy(uVar9);
              ARKodePrintAllStats(uVar10,_stdout,0);
              ARKodeFree(&local_48);
              SUNContext_Free(&local_c0);
              return 0;
            }
            pcVar12 = "ARKodeSetMaxNumSteps";
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nERROR: %s() failed with retval = %d\n\n",pcVar12,(ulong)uVar7);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  ProgramArgs args;
  UserData udata;
  SUNContext sunctx       = NULL;
  N_Vector y              = NULL;
  N_Vector solution       = NULL;
  sunrealtype* ydata      = NULL;
  void* arkode_mem        = NULL;
  int iout                = 0;
  int retval              = 0;
  int order               = 0;
  int use_compsums        = 0;
  int num_output_times    = 0;
  sunrealtype Tf          = SUN_RCONST(0.0);
  sunrealtype dt          = SUN_RCONST(0.0);
  sunrealtype dTout       = SUN_RCONST(0.0);
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype A     = SUN_RCONST(10.0);
  const sunrealtype phi   = SUN_RCONST(0.0);
  const sunrealtype omega = SUN_RCONST(1.0);

  /* Parse the command line arguments */
  if (ParseArgs(argc, argv, &args)) { return 1; };

  /* Default integrator options and problem parameters */
  order            = args.order;
  use_compsums     = args.use_compsums;
  num_output_times = args.num_output_times;
  Tf               = args.Tf;
  dt               = args.dt;
  dTout            = (Tf - T0) / ((sunrealtype)num_output_times);

  /* Default problem parameters */

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  printf("\n   Begin simple harmonic oscillator problem\n\n");

  /* Allocate and fill udata structure */
  udata.A     = A;
  udata.phi   = phi;
  udata.omega = omega;

  /* Allocate our state vector [x, v]^T */
  y        = N_VNew_Serial(2, sunctx);
  solution = N_VClone(y);

  /* Fill the initial conditions (x0 then v0) */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = A * cos(phi);
  ydata[1] = -A * omega * sin(phi);

  /* Create SPRKStep integrator */
  arkode_mem = SPRKStepCreate(xdot, vdot, T0, y, sunctx);

  retval = ARKodeSetOrder(arkode_mem, order);
  if (check_retval(&retval, "ARKodeSetOrder", 1)) { return 1; }

  retval = ARKodeSetUserData(arkode_mem, &udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
  if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

  retval = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 2);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n",
          (long double)tret, (long double)ydata[0],
          (long double)Energy(y, dt, &udata), (long double)SUN_RCONST(0.0));

  /* Do integration */
  for (iout = 0; iout < num_output_times; iout++)
  {
    if (args.use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
    retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

    /* Compute the analytical solution */
    Solution(tret, y, solution, &udata);

    /* Compute L2 error */
    N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), solution, solution);
    sunrealtype err = sqrt(N_VDotProd(solution, solution));

    /* Output current integration status */
    fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n",
            (long double)tret, (long double)ydata[0],
            (long double)Energy(y, dt, &udata), (long double)err);

    /* Check that solution error is within tolerance */
    if (err > SUNMAX(dt / pow(10, order - 2), 1000 * SUN_UNIT_ROUNDOFF))
    {
      fprintf(stderr, "FAILURE: solution error is too high\n");
      return 1;
    }

    /* Check if the solve was successful, if so, update the time and continue */
    if (retval >= 0)
    {
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    {
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }

  fprintf(stdout, "\n");
  N_VDestroy(y);
  N_VDestroy(solution);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&sunctx);

  return 0;
}